

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::setCurrentText(QComboBox *this,QString *text)

{
  int index;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0) == 0) {
    ::QVariant::QVariant(&local_40,(QString *)text);
    index = findData(this,&local_40,0,(MatchFlags)0x10);
    ::QVariant::~QVariant(&local_40);
    if (-1 < index) {
      setCurrentIndex(this,index);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    setEditText(this,text);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setCurrentText(const QString &text)
{
    if (isEditable()) {
        setEditText(text);
    } else {
        const int i = findText(text);
        if (i > -1)
            setCurrentIndex(i);
    }
}